

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookahead.c
# Opt level: O0

int av1_lookahead_push(lookahead_ctx *ctx,YV12_BUFFER_CONFIG *src,int64_t ts_start,int64_t ts_end,
                      int use_highbitdepth,_Bool alloc_pyramid,aom_enc_frame_flags_t flags)

{
  int iVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  int iVar5;
  lookahead_entry *__dest;
  int64_t in_RCX;
  int64_t in_RDX;
  int *in_RSI;
  lookahead_ctx *in_RDI;
  byte in_R9B;
  bool bVar6;
  aom_enc_frame_flags_t in_stack_00000008;
  YV12_BUFFER_CONFIG new_img;
  lookahead_entry *buf;
  int new_dimensions;
  int larger_dimensions;
  int subsampling_y;
  int subsampling_x;
  int uv_height;
  int uv_width;
  int height;
  int width;
  undefined4 uVar7;
  undefined4 in_stack_fffffffffffffeac;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  uint in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  undefined1 local_128 [3];
  undefined1 in_stack_fffffffffffffedb;
  int in_stack_fffffffffffffedc;
  int in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee4;
  int in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  YV12_BUFFER_CONFIG *in_stack_fffffffffffffef0;
  YV12_BUFFER_CONFIG *in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  int in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff38;
  int local_4;
  
  iVar5 = in_RSI[4];
  iVar1 = in_RSI[6];
  iVar2 = in_RSI[5];
  iVar3 = in_RSI[7];
  if (in_RDI->max_sz < (int)(in_RDI->read_ctxs[0].sz + (uint)in_RDI->max_pre_frames)) {
    local_4 = 1;
  }
  else {
    in_RDI->read_ctxs[0].sz = in_RDI->read_ctxs[0].sz + 1;
    if (in_RDI->read_ctxs[1].valid != 0) {
      in_RDI->read_ctxs[1].sz = in_RDI->read_ctxs[1].sz + 1;
    }
    __dest = pop(in_RDI,&in_RDI->write_idx);
    bVar6 = true;
    if (((iVar5 == (__dest->img).field_2.field_0.y_crop_width) &&
        (bVar6 = true, iVar1 == (__dest->img).field_3.field_0.y_crop_height)) &&
       (bVar6 = true, iVar2 == (__dest->img).field_2.field_0.uv_crop_width)) {
      bVar6 = iVar3 != (__dest->img).field_3.field_0.uv_crop_height;
    }
    bVar4 = true;
    if (((iVar5 <= (__dest->img).field_2.field_0.y_crop_width) &&
        (bVar4 = true, iVar1 <= (__dest->img).field_3.field_0.y_crop_height)) &&
       (bVar4 = true, iVar2 <= (__dest->img).field_2.field_0.uv_crop_width)) {
      bVar4 = (__dest->img).field_3.field_0.uv_crop_height < iVar3;
    }
    if (bVar4) {
      memset(local_128,0,0xd0);
      uVar7 = 0x120;
      in_stack_fffffffffffffeb0 = 0;
      in_stack_fffffffffffffeb8 = (uint)(in_R9B & 1);
      iVar5 = aom_alloc_frame_buffer
                        (in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,
                         in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,
                         in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,
                         in_stack_ffffffffffffff20,in_stack_ffffffffffffff28,
                         (_Bool)in_stack_fffffffffffffedb,in_stack_ffffffffffffff38);
      if (iVar5 != 0) {
        return 1;
      }
      aom_free_frame_buffer((YV12_BUFFER_CONFIG *)CONCAT44(in_stack_fffffffffffffeac,uVar7));
      memcpy(__dest,local_128,0xd0);
    }
    else if (bVar6) {
      (__dest->img).field_0.field_0.y_width = *in_RSI;
      (__dest->img).field_1.field_0.y_height = in_RSI[2];
      (__dest->img).field_0.field_0.uv_width = in_RSI[1];
      (__dest->img).field_1.field_0.uv_height = in_RSI[3];
      (__dest->img).field_2.field_0.y_crop_width = in_RSI[4];
      (__dest->img).field_3.field_0.y_crop_height = in_RSI[6];
      (__dest->img).field_2.field_0.uv_crop_width = in_RSI[5];
      (__dest->img).field_3.field_0.uv_crop_height = in_RSI[7];
      (__dest->img).subsampling_x = in_RSI[0x24];
      (__dest->img).subsampling_y = in_RSI[0x25];
    }
    av1_copy_and_extend_frame
              ((YV12_BUFFER_CONFIG *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               in_stack_ffffffffffffff18);
    __dest->ts_start = in_RDX;
    __dest->ts_end = in_RCX;
    __dest->display_idx = in_RDI->push_frame_count;
    __dest->flags = in_stack_00000008;
    in_RDI->push_frame_count = in_RDI->push_frame_count + 1;
    aom_remove_metadata_from_frame_buffer((YV12_BUFFER_CONFIG *)0x256086);
    if ((*(long *)(in_RSI + 0x32) == 0) ||
       (iVar5 = aom_copy_metadata_to_frame_buffer
                          ((YV12_BUFFER_CONFIG *)
                           CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                           (aom_metadata_array_t *)
                           CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0)),
       iVar5 == 0)) {
      local_4 = 0;
    }
    else {
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int av1_lookahead_push(struct lookahead_ctx *ctx, const YV12_BUFFER_CONFIG *src,
                       int64_t ts_start, int64_t ts_end, int use_highbitdepth,
                       bool alloc_pyramid, aom_enc_frame_flags_t flags) {
  int width = src->y_crop_width;
  int height = src->y_crop_height;
  int uv_width = src->uv_crop_width;
  int uv_height = src->uv_crop_height;
  int subsampling_x = src->subsampling_x;
  int subsampling_y = src->subsampling_y;
  int larger_dimensions, new_dimensions;

  assert(ctx->read_ctxs[ENCODE_STAGE].valid == 1);
  if (ctx->read_ctxs[ENCODE_STAGE].sz + ctx->max_pre_frames > ctx->max_sz)
    return 1;

  ctx->read_ctxs[ENCODE_STAGE].sz++;
  if (ctx->read_ctxs[LAP_STAGE].valid) {
    ctx->read_ctxs[LAP_STAGE].sz++;
  }

  struct lookahead_entry *buf = pop(ctx, &ctx->write_idx);

  new_dimensions = width != buf->img.y_crop_width ||
                   height != buf->img.y_crop_height ||
                   uv_width != buf->img.uv_crop_width ||
                   uv_height != buf->img.uv_crop_height;
  larger_dimensions =
      width > buf->img.y_crop_width || height > buf->img.y_crop_height ||
      uv_width > buf->img.uv_crop_width || uv_height > buf->img.uv_crop_height;
  assert(!larger_dimensions || new_dimensions);

  if (larger_dimensions) {
    YV12_BUFFER_CONFIG new_img;
    memset(&new_img, 0, sizeof(new_img));
    if (aom_alloc_frame_buffer(&new_img, width, height, subsampling_x,
                               subsampling_y, use_highbitdepth,
                               AOM_BORDER_IN_PIXELS, 0, alloc_pyramid, 0))
      return 1;
    aom_free_frame_buffer(&buf->img);
    buf->img = new_img;
  } else if (new_dimensions) {
    buf->img.y_width = src->y_width;
    buf->img.y_height = src->y_height;
    buf->img.uv_width = src->uv_width;
    buf->img.uv_height = src->uv_height;
    buf->img.y_crop_width = src->y_crop_width;
    buf->img.y_crop_height = src->y_crop_height;
    buf->img.uv_crop_width = src->uv_crop_width;
    buf->img.uv_crop_height = src->uv_crop_height;
    buf->img.subsampling_x = src->subsampling_x;
    buf->img.subsampling_y = src->subsampling_y;
  }
  av1_copy_and_extend_frame(src, &buf->img);

  buf->ts_start = ts_start;
  buf->ts_end = ts_end;
  buf->display_idx = ctx->push_frame_count;
  buf->flags = flags;
  ++ctx->push_frame_count;
  aom_remove_metadata_from_frame_buffer(&buf->img);
  if (src->metadata &&
      aom_copy_metadata_to_frame_buffer(&buf->img, src->metadata)) {
    return 1;
  }
  return 0;
}